

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseUnscopedName(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  bVar1 = ParseUnqualifiedName(state);
  if (bVar1) {
    state_local._7_1_ = true;
  }
  else {
    memcpy(local_48,(void *)copy._40_8_,0x30);
    bVar1 = ParseTwoCharToken((State *)copy._40_8_,"St");
    if (((bVar1) && (bVar1 = MaybeAppend((State *)copy._40_8_,"std::"), bVar1)) &&
       (bVar1 = ParseUnqualifiedName((State *)copy._40_8_), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      state_local._7_1_ = false;
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseUnscopedName(State *state) {
  if (ParseUnqualifiedName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseTwoCharToken(state, "St") &&
      MaybeAppend(state, "std::") &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}